

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *pIVar1;
  ImGuiWindow **ppIVar2;
  double *pdVar3;
  float fVar4;
  double dVar5;
  uint uVar6;
  ImGuiContext *pIVar7;
  ImGuiWindow *pIVar8;
  byte bVar9;
  ImGuiContext *g;
  byte bVar10;
  ImVec2 IVar11;
  byte bVar12;
  int iVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  ImGuiWindow *pIVar17;
  bool bVar18;
  float fVar19;
  
  pIVar7 = GImGui;
  pIVar17 = GImGui->MovingWindow;
  pIVar8 = (ImGuiWindow *)0x0;
  if ((pIVar17 != (ImGuiWindow *)0x0) && ((pIVar17->Flags & 0x200) == 0)) {
    pIVar8 = pIVar17;
  }
  pIVar1 = &(GImGui->Style).TouchExtraPadding;
  IVar11 = *pIVar1;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    fVar15 = (GImGui->Style).TouchExtraPadding.x;
    fVar19 = (GImGui->Style).TouchExtraPadding.y;
    if (fVar15 <= 4.0) {
      fVar15 = 4.0;
    }
    if (fVar19 <= 4.0) {
      fVar19 = 4.0;
    }
    IVar11.y = fVar19;
    IVar11.x = fVar15;
  }
  lVar14 = (long)(GImGui->Windows).Size;
  if (0 < lVar14) {
    lVar14 = lVar14 + 1;
    do {
      pIVar17 = (GImGui->Windows).Data[lVar14 + -2];
      bVar18 = false;
      if (((pIVar17->Active == true) && (pIVar17->Hidden == false)) &&
         (uVar6 = pIVar17->Flags, (uVar6 >> 9 & 1) == 0)) {
        fVar15 = IVar11.x;
        if ((uVar6 & 0x1000042) != 0) {
          fVar15 = pIVar1->x;
        }
        fVar19 = (GImGui->IO).MousePos.x;
        if ((pIVar17->OuterRectClipped).Min.x - fVar15 <= fVar19) {
          fVar16 = IVar11.y;
          if ((uVar6 & 0x1000042) != 0) {
            fVar16 = (GImGui->Style).TouchExtraPadding.y;
          }
          fVar4 = (GImGui->IO).MousePos.y;
          if ((((pIVar17->OuterRectClipped).Min.y - fVar16 <= fVar4) &&
              (fVar19 < fVar15 + (pIVar17->OuterRectClipped).Max.x)) &&
             (fVar4 < fVar16 + (pIVar17->OuterRectClipped).Max.y)) {
            if (pIVar8 == (ImGuiWindow *)0x0) {
              pIVar8 = pIVar17;
            }
            bVar18 = pIVar8 != (ImGuiWindow *)0x0;
          }
        }
      }
    } while ((!bVar18) && (lVar14 = lVar14 + -1, 1 < lVar14));
  }
  GImGui->HoveredWindow = pIVar8;
  if (pIVar8 == (ImGuiWindow *)0x0) {
    pIVar17 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar17 = pIVar8->RootWindow;
  }
  ppIVar2 = &pIVar7->HoveredWindow;
  pIVar7->HoveredRootWindow = pIVar17;
  pIVar8 = GetTopMostPopupModal();
  if (((pIVar8 != (ImGuiWindow *)0x0) && (pIVar17 != (ImGuiWindow *)0x0)) &&
     (pIVar17->RootWindow != pIVar8)) {
    do {
      if (pIVar17 == pIVar8) goto LAB_001d8ad2;
      pIVar17 = pIVar17->ParentWindow;
    } while (pIVar17 != (ImGuiWindow *)0x0);
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
LAB_001d8ad2:
  uVar6 = (pIVar7->IO).ConfigFlags;
  if ((uVar6 & 0x10) != 0) {
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  iVar13 = -1;
  lVar14 = 0;
  bVar9 = 0;
  do {
    if ((pIVar7->IO).MouseClicked[lVar14] == true) {
      bVar18 = true;
      if (*ppIVar2 == (ImGuiWindow *)0x0) {
        bVar18 = (pIVar7->OpenPopupStack).Size != 0;
      }
      (pIVar7->IO).MouseDownOwned[lVar14] = bVar18;
    }
    bVar18 = (pIVar7->IO).MouseDown[lVar14];
    if ((bVar18 == true) &&
       ((iVar13 == -1 ||
        (dVar5 = (pIVar7->IO).MouseClickedTime[iVar13],
        pdVar3 = (pIVar7->IO).MouseClickedTime + lVar14, *pdVar3 <= dVar5 && dVar5 != *pdVar3)))) {
      iVar13 = (int)lVar14;
    }
    bVar9 = bVar9 & 1 | bVar18;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  if (iVar13 == -1) {
    bVar10 = 1;
  }
  else {
    bVar10 = (pIVar7->IO).MouseDownOwned[iVar13];
  }
  if (pIVar7->DragDropActive == true) {
    bVar12 = ((byte)pIVar7->DragDropSourceFlags & 0x10) >> 4;
  }
  else {
    bVar12 = 0;
  }
  if (bVar12 == 0 && (bVar10 & 1) == 0) {
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar7->WantCaptureMouseNextFrame == -1) {
    if ((bVar10 == 0) || ((bVar18 = true, *ppIVar2 == (ImGuiWindow *)0x0 && (bVar9 == 0)))) {
      bVar18 = (pIVar7->OpenPopupStack).Size != 0;
    }
    (pIVar7->IO).WantCaptureMouse = bVar18;
  }
  else {
    (pIVar7->IO).WantCaptureMouse = pIVar7->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar7->WantCaptureKeyboardNextFrame == -1) {
    bVar18 = pIVar7->ActiveId != 0 || pIVar8 != (ImGuiWindow *)0x0;
  }
  else {
    bVar18 = pIVar7->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar7->IO).WantCaptureKeyboard = bVar18;
  if (((uVar6 & 9) == 1) && ((pIVar7->IO).NavActive != false)) {
    (pIVar7->IO).WantCaptureKeyboard = true;
  }
  (pIVar7->IO).WantTextInput = pIVar7->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    FindHoveredWindow();

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredRootWindow = g.HoveredWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}